

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O1

REF_STATUS ref_export_tec_edg_zone(REF_GRID ref_grid,FILE *file)

{
  REF_CELL ref_cell;
  REF_DBL *pRVar1;
  uint uVar2;
  REF_STATUS RVar3;
  long lVar4;
  undefined8 uVar5;
  REF_NODE pRVar6;
  long lVar7;
  char *pcVar8;
  int iVar9;
  REF_INT nnode;
  REF_DICT ref_dict;
  REF_INT nedge;
  REF_INT *l2g;
  REF_INT *g2l;
  REF_INT nodes [27];
  uint local_ec;
  uint local_e4;
  REF_DICT local_e0;
  uint local_d4;
  REF_INT *local_d0;
  REF_INT *local_c8;
  REF_GRID local_c0;
  long local_b8;
  REF_NODE local_b0;
  uint local_a8 [30];
  
  pRVar6 = ref_grid->node;
  uVar2 = ref_dict_create(&local_e0);
  if (uVar2 == 0) {
    ref_cell = ref_grid->cell[0];
    local_c0 = ref_grid;
    if (0 < ref_cell->max) {
      iVar9 = 0;
      do {
        RVar3 = ref_cell_nodes(ref_cell,iVar9,(REF_INT *)local_a8);
        if ((RVar3 == 0) &&
           (uVar2 = ref_dict_store(local_e0,local_a8[ref_cell->node_per],-1), uVar2 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0xf3,"ref_export_tec_edg_zone",(ulong)uVar2,"mark tri");
          return uVar2;
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < ref_cell->max);
    }
    if (local_e0->n < 1) {
      local_ec = 0xffffffff;
    }
    else {
      local_ec = *local_e0->key;
    }
    if (0 < local_e0->n) {
      lVar7 = 0;
      local_b0 = pRVar6;
      do {
        local_b8 = lVar7;
        uVar2 = ref_grid_cell_id_nodes
                          (local_c0,ref_cell,local_ec,(REF_INT *)&local_e4,(REF_INT *)&local_d4,
                           &local_c8,&local_d0);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0xf9,"ref_export_tec_edg_zone",(ulong)uVar2,"extract this edge");
          return uVar2;
        }
        fprintf((FILE *)file,
                "zone t=\"edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                (ulong)local_ec,(ulong)local_e4,(ulong)local_d4,"point","felineseg");
        if (0 < (int)local_e4) {
          lVar7 = 0;
          do {
            pRVar1 = pRVar6->real;
            lVar4 = (long)local_d0[lVar7];
            fprintf((FILE *)file," %.16e %.16e %.16e\n",pRVar1[lVar4 * 0xf],pRVar1[lVar4 * 0xf + 1],
                    pRVar1[lVar4 * 0xf + 2]);
            lVar7 = lVar7 + 1;
          } while (lVar7 < (int)local_e4);
        }
        if (0 < ref_cell->max) {
          iVar9 = 0;
          do {
            RVar3 = ref_cell_nodes(ref_cell,iVar9,(REF_INT *)local_a8);
            if ((RVar3 == 0) && (local_ec == local_a8[ref_cell->node_per])) {
              if (0 < ref_cell->node_per) {
                lVar7 = 0;
                do {
                  fprintf((FILE *)file," %d",(ulong)(local_c8[(int)local_a8[lVar7]] + 1));
                  lVar7 = lVar7 + 1;
                } while (lVar7 < ref_cell->node_per);
              }
              fputc(10,(FILE *)file);
              pRVar6 = local_b0;
            }
            iVar9 = iVar9 + 1;
          } while (iVar9 < ref_cell->max);
        }
        if (local_d0 != (REF_INT *)0x0) {
          free(local_d0);
        }
        if (local_c8 != (REF_INT *)0x0) {
          free(local_c8);
        }
        lVar7 = local_b8 + 1;
        local_ec = 0xffffffff;
        if (lVar7 < local_e0->n) {
          local_ec = local_e0->key[lVar7];
        }
      } while (lVar7 < local_e0->n);
    }
    uVar2 = ref_dict_free(local_e0);
    if (uVar2 == 0) {
      return 0;
    }
    pcVar8 = "free dict";
    uVar5 = 0x113;
  }
  else {
    pcVar8 = "create dict";
    uVar5 = 0xee;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar5,
         "ref_export_tec_edg_zone",(ulong)uVar2,pcVar8);
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_export_tec_edg_zone(REF_GRID ref_grid,
                                                  FILE *file) {
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *g2l, *l2g;
  REF_INT nedge;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell, cell_node;
  REF_INT nnode;
  REF_DICT ref_dict;
  REF_INT boundary_tag, boundary_index;

  ref_node = ref_grid_node(ref_grid);

  RSS(ref_dict_create(&ref_dict), "create dict");

  ref_cell = ref_grid_edg(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_dict_store(ref_dict, nodes[ref_cell_id_index(ref_cell)], REF_EMPTY),
        "mark tri");
  }

  each_ref_dict_key(ref_dict, boundary_index, boundary_tag) {
    RSS(ref_grid_cell_id_nodes(ref_grid, ref_cell, boundary_tag, &nnode, &nedge,
                               &g2l, &l2g),
        "extract this edge");

    fprintf(file,
            "zone t=\"edge%d\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            boundary_tag, nnode, nedge, "point", "felineseg");

    for (node = 0; node < nnode; node++)
      fprintf(file, " %.16e %.16e %.16e\n",
              ref_node_xyz(ref_node, 0, l2g[node]),
              ref_node_xyz(ref_node, 1, l2g[node]),
              ref_node_xyz(ref_node, 2, l2g[node]));

    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (boundary_tag == nodes[ref_cell_id_index(ref_cell)]) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          fprintf(file, " %d", g2l[nodes[cell_node]] + 1);
        }
        fprintf(file, "\n");
      }
    }

    ref_free(l2g);
    ref_free(g2l);
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}